

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifold_tracing_test.cpp
# Opt level: O2

void __thiscall manifold_tracing::test_method(manifold_tracing *this)

{
  ostream *poVar1;
  __node_base _Var2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_530;
  undefined **local_518;
  ulong local_510;
  shared_count sStack_508;
  char **local_500;
  char *local_4f8;
  char *local_4f0;
  pair<const_Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  si_pair_1;
  Out_simplex_map interior_simplex_map;
  undefined1 local_470 [16];
  VectorXd seed;
  Out_simplex_map boundary_simplex_map;
  vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  seed_points;
  char *local_400;
  char *local_3f8;
  undefined1 *local_3f0;
  undefined1 *local_3e8;
  char *local_3e0;
  char *local_3d8;
  char *local_3d0;
  char *local_3c8;
  undefined1 *local_3c0;
  undefined1 *local_3b8;
  char *local_3b0;
  char *local_3a8;
  char *local_3a0;
  char *local_398;
  undefined1 *local_390;
  undefined1 *local_388;
  char *local_380;
  char *local_378;
  char *local_370;
  char *local_368;
  undefined1 *local_360;
  undefined1 *local_358;
  char *local_350;
  char *local_348;
  char *local_340;
  char *local_338;
  undefined1 *local_330;
  undefined1 *local_328;
  char *local_320;
  char *local_318;
  char *local_310;
  char *local_308;
  undefined1 *local_300;
  undefined1 *local_2f8;
  char *local_2f0;
  char *local_2e8;
  Implicit_manifold_intersection_oracle<Gudhi::coxeter_triangulation::Function_Sm_in_Rd,_Gudhi::coxeter_triangulation::Constant_function>
  oracle;
  Implicit_manifold_intersection_oracle<Gudhi::coxeter_triangulation::Function_Sm_in_Rd,_Gudhi::coxeter_triangulation::Function_Sm_in_Rd>
  oracle_with_boundary;
  Out_simplex_map out_simplex_map;
  Function_Sm_in_Rd fun_sph;
  Function_Sm_in_Rd fun_boundary;
  char *local_178;
  char *local_170;
  char *local_168;
  char *local_160;
  undefined1 *local_158;
  undefined1 *local_150;
  char *local_148;
  char *local_140;
  char *local_138;
  char *local_130;
  undefined1 *local_128;
  undefined1 *local_120;
  char *local_118;
  char *local_110;
  Coxeter_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  cox_tr;
  
  Gudhi::coxeter_triangulation::Function_Sm_in_Rd::Function_Sm_in_Rd(&fun_sph,5.1111,2);
  Gudhi::coxeter_triangulation::
  Implicit_manifold_intersection_oracle<Gudhi::coxeter_triangulation::Function_Sm_in_Rd,_Gudhi::coxeter_triangulation::Constant_function>
  ::Implicit_manifold_intersection_oracle(&oracle,&fun_sph);
  Gudhi::coxeter_triangulation::
  Coxeter_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  ::Coxeter_triangulation(&cox_tr,oracle.fun_.d_);
  Gudhi::coxeter_triangulation::Function_Sm_in_Rd::seed((Function_Sm_in_Rd *)&seed);
  std::
  vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::vector(&seed_points,1,&seed,(allocator_type *)&oracle_with_boundary);
  out_simplex_map._M_h._M_buckets = &out_simplex_map._M_h._M_single_bucket;
  out_simplex_map._M_h._M_bucket_count = 1;
  out_simplex_map._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  out_simplex_map._M_h._M_element_count = 0;
  out_simplex_map._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  out_simplex_map._M_h._M_rehash_policy._M_next_resize = 0;
  out_simplex_map._M_h._M_single_bucket = (__node_base_ptr)0x0;
  Gudhi::coxeter_triangulation::
  manifold_tracing_algorithm<std::vector<Eigen::Matrix<double,_1,1,0,_1,1>,std::allocator<Eigen::Matrix<double,_1,1,0,_1,1>>>,Gudhi::coxeter_triangulation::Coxeter_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,std::allocator<int>>,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>>,Gudhi::coxeter_triangulation::Implicit_manifold_intersection_oracle<Gudhi::coxeter_triangulation::Function_Sm_in_Rd,Gudhi::coxeter_triangulation::Constant_function>,std::unordered_map<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,std::allocator<int>>,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>,Eigen::Matrix<double,_1,1,0,_1,1>,Gudhi::coxeter_triangulation::Manifold_tracing<Gudhi::coxeter_triangulation::Coxeter_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,std::allocator<int>>,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>>>::Simplex_hash,std::equal_to<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,std::allocator<int>>,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>>,std::allocator<std::pair<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,std::allocator<int>>,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>const,Eigen::Matrix<double,_1,1,0,_1,1>>>>>
            (&seed_points,&cox_tr,&oracle,&out_simplex_map);
  for (_Var2 = out_simplex_map._M_h._M_before_begin; _Var2._M_nxt != (_Hash_node_base *)0x0;
      _Var2._M_nxt = (_Var2._M_nxt)->_M_nxt) {
    std::
    pair<const_Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>
    ::pair((pair<const_Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
            *)&oracle_with_boundary,
           (pair<const_Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
            *)(_Var2._M_nxt + 1));
    local_2f0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Coxeter_triangulation/test/manifold_tracing_test.cpp"
    ;
    local_2e8 = "";
    local_300 = &boost::unit_test::basic_cstring<char_const>::null;
    local_2f8 = &boost::unit_test::basic_cstring<char_const>::null;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2f0,0x27,&local_300);
    interior_simplex_map._M_h._M_buckets =
         (__buckets_ptr)
         CONCAT71(interior_simplex_map._M_h._M_buckets._1_7_,
                  ((long)oracle_with_boundary.fun_.center_.
                         super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                         m_data - (long)oracle_with_boundary.fun_.r_) / 0x18 - 1U == oracle.fun_.k_)
    ;
    interior_simplex_map._M_h._M_bucket_count = 0;
    interior_simplex_map._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    boundary_simplex_map._M_h._M_buckets = (__buckets_ptr)anon_var_dwarf_1b5835;
    boundary_simplex_map._M_h._M_bucket_count =
         (long)"si_pair.first.dimension() == oracle.function().cod_d()" + 0x36;
    si_pair_1.first.vertex_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)((ulong)si_pair_1.first.vertex_.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
    si_pair_1.first.vertex_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_0015ed20;
    si_pair_1.first.vertex_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)&boost::unit_test::lazy_ostream::inst;
    si_pair_1.first.partition_.
    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)&boundary_simplex_map;
    local_310 = 
    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Coxeter_triangulation/test/manifold_tracing_test.cpp"
    ;
    local_308 = "";
    boost::test_tools::tt_detail::report_assertion
              (&interior_simplex_map,&si_pair_1,&local_310,0x27,1,0,0);
    boost::detail::shared_count::~shared_count
              ((shared_count *)&interior_simplex_map._M_h._M_before_begin);
    local_320 = 
    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Coxeter_triangulation/test/manifold_tracing_test.cpp"
    ;
    local_318 = "";
    local_330 = &boost::unit_test::basic_cstring<char_const>::null;
    local_328 = &boost::unit_test::basic_cstring<char_const>::null;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_320,0x28,&local_330);
    interior_simplex_map._M_h._M_buckets =
         (__buckets_ptr)
         CONCAT71(interior_simplex_map._M_h._M_buckets._1_7_,
                  oracle_with_boundary.domain_fun_.k_ == oracle.fun_.d_);
    interior_simplex_map._M_h._M_bucket_count = 0;
    interior_simplex_map._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    boundary_simplex_map._M_h._M_buckets = (__buckets_ptr)anon_var_dwarf_1b584e;
    boundary_simplex_map._M_h._M_bucket_count =
         (long)"si_pair.second.size() == (long int)oracle.function().amb_d()" + 0x3c;
    si_pair_1.first.vertex_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)((ulong)si_pair_1.first.vertex_.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
    si_pair_1.first.vertex_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_0015ed20;
    si_pair_1.first.vertex_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)&boost::unit_test::lazy_ostream::inst;
    si_pair_1.first.partition_.
    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)&boundary_simplex_map;
    local_340 = 
    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Coxeter_triangulation/test/manifold_tracing_test.cpp"
    ;
    local_338 = "";
    boost::test_tools::tt_detail::report_assertion
              (&interior_simplex_map,&si_pair_1,&local_340,0x28,1,0,0);
    boost::detail::shared_count::~shared_count
              ((shared_count *)&interior_simplex_map._M_h._M_before_begin);
    std::
    pair<const_Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>
    ::~pair((pair<const_Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
             *)&oracle_with_boundary);
  }
  poVar1 = std::operator<<((ostream *)&std::clog,"out_simplex_map.size() = ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1,"\n");
  local_118 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Coxeter_triangulation/test/manifold_tracing_test.cpp"
  ;
  local_110 = "";
  local_128 = &boost::unit_test::basic_cstring<char_const>::null;
  local_120 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_118,0x2b);
  si_pair_1.first.vertex_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT71(si_pair_1.first.vertex_.super__Vector_base<int,_std::allocator<int>_>.
                         _M_impl.super__Vector_impl_data._M_start._1_7_,
                         out_simplex_map._M_h._M_element_count == 0x45e);
  si_pair_1.first.vertex_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  si_pair_1.first.vertex_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  interior_simplex_map._M_h._M_buckets = (__buckets_ptr)anon_var_dwarf_1b588b;
  interior_simplex_map._M_h._M_bucket_count = (long)"out_simplex_map.size() == 1118" + 0x1e;
  oracle_with_boundary.fun_.k_._0_1_ = 0;
  oracle_with_boundary.fun_.m_ = (size_t)&PTR__lazy_ostream_0015ed20;
  oracle_with_boundary.fun_.d_ = (size_t)&boost::unit_test::lazy_ostream::inst;
  oracle_with_boundary.fun_.r_ = (double)&interior_simplex_map;
  local_138 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Coxeter_triangulation/test/manifold_tracing_test.cpp"
  ;
  local_130 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &si_pair_1.first.vertex_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  Gudhi::coxeter_triangulation::Function_Sm_in_Rd::seed((Function_Sm_in_Rd *)local_470);
  Gudhi::coxeter_triangulation::Function_Sm_in_Rd::Function_Sm_in_Rd
            (&fun_boundary,3.0,2,(VectorXd *)local_470);
  free((void *)local_470._0_8_);
  Gudhi::coxeter_triangulation::
  Implicit_manifold_intersection_oracle<Gudhi::coxeter_triangulation::Function_Sm_in_Rd,_Gudhi::coxeter_triangulation::Function_Sm_in_Rd>
  ::Implicit_manifold_intersection_oracle(&oracle_with_boundary,&fun_sph,&fun_boundary);
  interior_simplex_map._M_h._M_buckets = &interior_simplex_map._M_h._M_single_bucket;
  interior_simplex_map._M_h._M_bucket_count = 1;
  interior_simplex_map._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  interior_simplex_map._M_h._M_element_count = 0;
  interior_simplex_map._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  interior_simplex_map._M_h._M_rehash_policy._M_next_resize = 0;
  interior_simplex_map._M_h._M_single_bucket = (__node_base_ptr)0x0;
  boundary_simplex_map._M_h._M_buckets = &boundary_simplex_map._M_h._M_single_bucket;
  boundary_simplex_map._M_h._M_bucket_count = 1;
  boundary_simplex_map._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  boundary_simplex_map._M_h._M_element_count = 0;
  boundary_simplex_map._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  boundary_simplex_map._M_h._M_rehash_policy._M_next_resize = 0;
  boundary_simplex_map._M_h._M_single_bucket = (__node_base_ptr)0x0;
  Gudhi::coxeter_triangulation::
  manifold_tracing_algorithm<std::vector<Eigen::Matrix<double,_1,1,0,_1,1>,std::allocator<Eigen::Matrix<double,_1,1,0,_1,1>>>,Gudhi::coxeter_triangulation::Coxeter_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,std::allocator<int>>,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>>,Gudhi::coxeter_triangulation::Implicit_manifold_intersection_oracle<Gudhi::coxeter_triangulation::Function_Sm_in_Rd,Gudhi::coxeter_triangulation::Function_Sm_in_Rd>,std::unordered_map<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,std::allocator<int>>,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>,Eigen::Matrix<double,_1,1,0,_1,1>,Gudhi::coxeter_triangulation::Manifold_tracing<Gudhi::coxeter_triangulation::Coxeter_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,std::allocator<int>>,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>>>::Simplex_hash,std::equal_to<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,std::allocator<int>>,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>>,std::allocator<std::pair<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,std::allocator<int>>,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>const,Eigen::Matrix<double,_1,1,0,_1,1>>>>>
            (&seed_points,&cox_tr,&oracle_with_boundary,&interior_simplex_map,&boundary_simplex_map)
  ;
  for (_Var2 = interior_simplex_map._M_h._M_before_begin; _Var2._M_nxt != (_Hash_node_base *)0x0;
      _Var2._M_nxt = (_Var2._M_nxt)->_M_nxt) {
    std::
    pair<const_Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>
    ::pair(&si_pair_1,
           (pair<const_Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
            *)(_Var2._M_nxt + 1));
    local_350 = 
    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Coxeter_triangulation/test/manifold_tracing_test.cpp"
    ;
    local_348 = "";
    local_360 = &boost::unit_test::basic_cstring<char_const>::null;
    local_358 = &boost::unit_test::basic_cstring<char_const>::null;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_350,0x33,&local_360);
    local_530.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_530.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_4f8 = "si_pair.first.dimension() == oracle.function().cod_d()";
    local_4f0 = "";
    local_510 = local_510 & 0xffffffffffffff00;
    local_518 = &PTR__lazy_ostream_0015ed20;
    sStack_508.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
    local_500 = &local_4f8;
    local_370 = 
    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Coxeter_triangulation/test/manifold_tracing_test.cpp"
    ;
    local_368 = "";
    local_530.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ =
         ((long)si_pair_1.first.partition_.
                super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
         (long)si_pair_1.first.partition_.
               super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start) / 0x18 - 1U == oracle.fun_.k_;
    boost::test_tools::tt_detail::report_assertion(&local_530,&local_518,&local_370,0x33,1,0,0);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &local_530.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    local_380 = 
    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Coxeter_triangulation/test/manifold_tracing_test.cpp"
    ;
    local_378 = "";
    local_390 = &boost::unit_test::basic_cstring<char_const>::null;
    local_388 = &boost::unit_test::basic_cstring<char_const>::null;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_380,0x34,&local_390);
    local_530.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT71(local_530.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start._1_7_,
                           si_pair_1.second.
                           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                           m_rows == oracle.fun_.d_);
    local_530.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_530.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_4f8 = "si_pair.second.size() == (long int)oracle.function().amb_d()";
    local_4f0 = "";
    local_510 = local_510 & 0xffffffffffffff00;
    local_518 = &PTR__lazy_ostream_0015ed20;
    sStack_508.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
    local_500 = &local_4f8;
    local_3a0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Coxeter_triangulation/test/manifold_tracing_test.cpp"
    ;
    local_398 = "";
    boost::test_tools::tt_detail::report_assertion(&local_530,&local_518,&local_3a0,0x34,1,0,0);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &local_530.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::
    pair<const_Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>
    ::~pair(&si_pair_1);
  }
  poVar1 = std::operator<<((ostream *)&std::clog,"interior_simplex_map.size() = ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1,"\n");
  local_148 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Coxeter_triangulation/test/manifold_tracing_test.cpp"
  ;
  local_140 = "";
  local_158 = &boost::unit_test::basic_cstring<char_const>::null;
  local_150 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_148,0x37);
  local_518 = (undefined **)
              CONCAT71(local_518._1_7_,interior_simplex_map._M_h._M_element_count == 0x60);
  local_510 = 0;
  sStack_508.pi_ = (sp_counted_base *)0x0;
  local_530.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x12a45f;
  local_530.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x12a480;
  si_pair_1.first.vertex_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)si_pair_1.first.vertex_.super__Vector_base<int,_std::allocator<int>_>.
                        _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  si_pair_1.first.vertex_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_0015ed20;
  si_pair_1.first.vertex_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)&boost::unit_test::lazy_ostream::inst;
  si_pair_1.first.partition_.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = &local_530;
  local_168 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Coxeter_triangulation/test/manifold_tracing_test.cpp"
  ;
  local_160 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_508);
  for (_Var2 = boundary_simplex_map._M_h._M_before_begin; _Var2._M_nxt != (_Hash_node_base *)0x0;
      _Var2._M_nxt = (_Var2._M_nxt)->_M_nxt) {
    std::
    pair<const_Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>
    ::pair(&si_pair_1,
           (pair<const_Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
            *)(_Var2._M_nxt + 1));
    local_3b0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Coxeter_triangulation/test/manifold_tracing_test.cpp"
    ;
    local_3a8 = "";
    local_3c0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_3b8 = &boost::unit_test::basic_cstring<char_const>::null;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_3b0,0x39,&local_3c0);
    local_530.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_530.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_4f8 = "si_pair.first.dimension() == oracle.function().cod_d() + 1";
    local_4f0 = "";
    local_510 = local_510 & 0xffffffffffffff00;
    local_518 = &PTR__lazy_ostream_0015ed20;
    sStack_508.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
    local_500 = &local_4f8;
    local_3d0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Coxeter_triangulation/test/manifold_tracing_test.cpp"
    ;
    local_3c8 = "";
    local_530.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ =
         ((long)si_pair_1.first.partition_.
                super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
         (long)si_pair_1.first.partition_.
               super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start) / 0x18 == oracle.fun_.k_ + 2;
    boost::test_tools::tt_detail::report_assertion(&local_530,&local_518,&local_3d0,0x39,1,0,0);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &local_530.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    local_3e0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Coxeter_triangulation/test/manifold_tracing_test.cpp"
    ;
    local_3d8 = "";
    local_3f0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_3e8 = &boost::unit_test::basic_cstring<char_const>::null;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_3e0,0x3a,&local_3f0);
    local_530.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT71(local_530.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start._1_7_,
                           si_pair_1.second.
                           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                           m_rows == oracle.fun_.d_);
    local_530.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_530.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_4f8 = "si_pair.second.size() == (long int)oracle.function().amb_d()";
    local_4f0 = "";
    local_510 = local_510 & 0xffffffffffffff00;
    local_518 = &PTR__lazy_ostream_0015ed20;
    sStack_508.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
    local_500 = &local_4f8;
    local_400 = 
    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Coxeter_triangulation/test/manifold_tracing_test.cpp"
    ;
    local_3f8 = "";
    boost::test_tools::tt_detail::report_assertion(&local_530,&local_518,&local_400,0x3a,1,0,0);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &local_530.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::
    pair<const_Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>
    ::~pair(&si_pair_1);
  }
  poVar1 = std::operator<<((ostream *)&std::clog,"boundary_simplex_map.size() = ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1,"\n");
  local_178 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Coxeter_triangulation/test/manifold_tracing_test.cpp"
  ;
  local_170 = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_178,0x3d);
  local_518 = (undefined **)
              CONCAT71(local_518._1_7_,boundary_simplex_map._M_h._M_element_count == 0x36);
  local_510 = 0;
  sStack_508.pi_ = (sp_counted_base *)0x0;
  local_530.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x12a4db;
  local_530.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x12a4fc;
  si_pair_1.first.vertex_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)si_pair_1.first.vertex_.super__Vector_base<int,_std::allocator<int>_>.
                        _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  si_pair_1.first.vertex_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_0015ed20;
  si_pair_1.first.vertex_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)&boost::unit_test::lazy_ostream::inst;
  si_pair_1.first.partition_.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = &local_530;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_508);
  std::
  _Hashtable<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::pair<const_Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_std::allocator<std::pair<const_Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>,_std::__detail::_Select1st,_std::equal_to<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_Gudhi::coxeter_triangulation::Manifold_tracing<Gudhi::coxeter_triangulation::Coxeter_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>::Simplex_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&boundary_simplex_map._M_h);
  std::
  _Hashtable<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::pair<const_Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_std::allocator<std::pair<const_Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>,_std::__detail::_Select1st,_std::equal_to<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_Gudhi::coxeter_triangulation::Manifold_tracing<Gudhi::coxeter_triangulation::Coxeter_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>::Simplex_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&interior_simplex_map._M_h);
  Gudhi::coxeter_triangulation::
  Implicit_manifold_intersection_oracle<Gudhi::coxeter_triangulation::Function_Sm_in_Rd,_Gudhi::coxeter_triangulation::Function_Sm_in_Rd>
  ::~Implicit_manifold_intersection_oracle(&oracle_with_boundary);
  free(fun_boundary.center_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
       .m_data);
  std::
  _Hashtable<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::pair<const_Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_std::allocator<std::pair<const_Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>,_std::__detail::_Select1st,_std::equal_to<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_Gudhi::coxeter_triangulation::Manifold_tracing<Gudhi::coxeter_triangulation::Coxeter_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>::Simplex_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&out_simplex_map._M_h);
  std::
  vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::~vector(&seed_points);
  free(seed.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  Gudhi::coxeter_triangulation::
  Freudenthal_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  ::~Freudenthal_triangulation
            (&cox_tr.
              super_Freudenthal_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
            );
  Gudhi::coxeter_triangulation::
  Implicit_manifold_intersection_oracle<Gudhi::coxeter_triangulation::Function_Sm_in_Rd,_Gudhi::coxeter_triangulation::Constant_function>
  ::~Implicit_manifold_intersection_oracle(&oracle);
  free(fun_sph.center_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
       m_data);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(manifold_tracing) {
  // manifold without boundary
  Function_Sm_in_Rd fun_sph(5.1111, 2);
  auto oracle = make_oracle(fun_sph);
  Coxeter_triangulation<> cox_tr(oracle.amb_d());
  // cox_tr.change_offset(Eigen::VectorXd::Random(oracle.amb_d()));

  using MT = Manifold_tracing<Coxeter_triangulation<> >;
  Eigen::VectorXd seed = fun_sph.seed();
  std::vector<Eigen::VectorXd> seed_points(1, seed);
  typename MT::Out_simplex_map out_simplex_map;
  manifold_tracing_algorithm(seed_points, cox_tr, oracle, out_simplex_map);

  for (auto si_pair : out_simplex_map) {
    BOOST_CHECK(si_pair.first.dimension() == oracle.function().cod_d());
    BOOST_CHECK(si_pair.second.size() == (long int)oracle.function().amb_d());
  }
  std::clog << "out_simplex_map.size() = " << out_simplex_map.size() << "\n";
  BOOST_CHECK(out_simplex_map.size() == 1118);

  // manifold with boundary
  Function_Sm_in_Rd fun_boundary(3.0, 2, fun_sph.seed());
  auto oracle_with_boundary = make_oracle(fun_sph, fun_boundary);
  typename MT::Out_simplex_map interior_simplex_map, boundary_simplex_map;
  manifold_tracing_algorithm(seed_points, cox_tr, oracle_with_boundary, interior_simplex_map, boundary_simplex_map);
  for (auto si_pair : interior_simplex_map) {
    BOOST_CHECK(si_pair.first.dimension() == oracle.function().cod_d());
    BOOST_CHECK(si_pair.second.size() == (long int)oracle.function().amb_d());
  }
  std::clog << "interior_simplex_map.size() = " << interior_simplex_map.size() << "\n";
  BOOST_CHECK(interior_simplex_map.size() == 96);
  for (auto si_pair : boundary_simplex_map) {
    BOOST_CHECK(si_pair.first.dimension() == oracle.function().cod_d() + 1);
    BOOST_CHECK(si_pair.second.size() == (long int)oracle.function().amb_d());
  }
  std::clog << "boundary_simplex_map.size() = " << boundary_simplex_map.size() << "\n";
  BOOST_CHECK(boundary_simplex_map.size() == 54);
}